

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

ptls_cipher_suite_t * find_aes128gcmsha256(ptls_context_t *ctx)

{
  ptls_cipher_suite_t *ppVar1;
  ptls_cipher_suite_t **pppVar2;
  
  pppVar2 = ctx->cipher_suites;
  do {
    ppVar1 = *pppVar2;
    if (ppVar1 == (ptls_cipher_suite_t *)0x0) {
      __assert_fail("!\"FIXME\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                    ,0x25,"ptls_cipher_suite_t *find_aes128gcmsha256(ptls_context_t *)");
    }
    pppVar2 = pppVar2 + 1;
  } while (ppVar1->id != 0x1301);
  return ppVar1;
}

Assistant:

static ptls_cipher_suite_t *find_aes128gcmsha256(ptls_context_t *ctx)
{
    ptls_cipher_suite_t **cs;
    for (cs = ctx->cipher_suites; *cs != NULL; ++cs)
        if ((*cs)->id == PTLS_CIPHER_SUITE_AES_128_GCM_SHA256)
            return *cs;
    assert(!"FIXME");
}